

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bidirectional.cc
# Opt level: O3

void __thiscall bidirectional::BiDirectional::joinLabels(BiDirectional *this)

{
  double dVar1;
  int iVar2;
  Params *pPVar3;
  Search *pSVar4;
  DiGraph *pDVar5;
  long lVar6;
  Label *pLVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Vertex VVar8;
  _Base_ptr p_Var9;
  bool bVar10;
  double *fwd_min;
  double *pdVar11;
  long lVar12;
  _Base_ptr p_Var13;
  long lVar14;
  Label *bwd_label;
  long lVar15;
  _Head_base<0UL,_lemon::SmartDigraph_*,_false> _Var16;
  Label *fwd_label;
  undefined4 uVar17;
  undefined4 uVar18;
  vector<labelling::Label,_std::allocator<labelling::Label>_> merged_labels_;
  bool local_169;
  double local_168;
  double *local_160;
  long local_158;
  int local_14c;
  double *local_148;
  vector<double,_std::allocator<double>_> *local_140;
  double *local_138;
  Params *local_130;
  LemonArc local_128 [2];
  _Tuple_impl<0UL,_lemon::SmartDigraph_*,_std::default_delete<lemon::SmartDigraph>_> local_120;
  AdjVertex local_118;
  vector<labelling::Label,_std::allocator<labelling::Label>_> local_e8;
  _Base_ptr local_c8;
  _Base_ptr local_c0;
  double local_b8;
  Label local_b0;
  
  pPVar3 = (this->params_ptr_)._M_t.
           super___uniq_ptr_impl<bidirectional::Params,_std::default_delete<bidirectional::Params>_>
           ._M_t.
           super__Tuple_impl<0UL,_bidirectional::Params_*,_std::default_delete<bidirectional::Params>_>
           .super__Head_base<0UL,_bidirectional::Params_*,_false>._M_head_impl;
  local_168 = getUB(this);
  iVar2 = pPVar3->critical_res;
  local_138 = (this->max_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + iVar2;
  pdVar11 = (this->min_res_curr_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start + iVar2;
  dVar1 = *local_138;
  if (*pdVar11 <= dVar1 && dVar1 != *pdVar11) {
    local_138 = pdVar11;
  }
  local_130 = pPVar3;
  fwd_min = (double *)operator_new(8);
  *fwd_min = 0.0;
  local_148 = fwd_min;
  pdVar11 = (double *)operator_new(8);
  *pdVar11 = 0.0;
  getMinimumWeights(this,fwd_min,pdVar11);
  local_e8.super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8.super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.super__Vector_base<labelling::Label,_std::allocator<labelling::Label>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pSVar4 = (this->fwd_search_ptr_)._M_t.
           super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
           ._M_t.
           super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
           .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl;
  p_Var13 = *(_Base_ptr *)((long)&(pSVar4->visited_vertices)._M_t + 0x18);
  local_c8 = (_Base_ptr)((long)&(pSVar4->visited_vertices)._M_t + 8);
  if (p_Var13 != local_c8) {
    local_140 = &this->min_res;
    local_160 = pdVar11;
    do {
      pSVar4 = (this->fwd_search_ptr_)._M_t.
               super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
               ._M_t.
               super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
               .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl;
      lVar12 = (long)(int)p_Var13[1]._M_color;
      if (((**(double **)
              (*(long *)&(pSVar4->best_labels).
                         super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                         ._M_impl + lVar12 * 0x10) + *pdVar11 <= local_168) &&
          (p_Var13[1]._M_color !=
           (((this->graph_ptr_)._M_t.
             super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
             ._M_t.
             super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
             .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl)->sink).lemon_id))
         && (lVar14 = *(long *)&(pSVar4->efficient_labels).
                                super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                                ._M_impl, fwd_label = *(Label **)(lVar14 + lVar12 * 0x18),
            p_Var9 = p_Var13, fwd_label != *(Label **)(lVar14 + 8 + lVar12 * 0x18))) {
        do {
          local_c0 = p_Var9;
          if (((fwd_label->resource_consumption).super__Vector_base<double,_std::allocator<double>_>
               ._M_impl.super__Vector_impl_data._M_start[local_130->critical_res] <= *local_138) &&
             (fwd_label->weight + *pdVar11 <= local_168)) {
            _Var16._M_head_impl =
                 *(SmartDigraph **)
                  &(((this->graph_ptr_)._M_t.
                     super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                     .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl)->
                   lemon_graph_ptr)._M_t.
                   super___uniq_ptr_impl<lemon::SmartDigraph,_std::default_delete<lemon::SmartDigraph>_>
            ;
            local_128[0]._id =
                 *(int *)(*(long *)&(_Var16._M_head_impl)->super_ExtendedSmartDigraphBase + 4 +
                         lVar12 * 8);
            local_120.super__Head_base<0UL,_lemon::SmartDigraph_*,_false>._M_head_impl =
                 (_Head_base<0UL,_lemon::SmartDigraph_*,_false>)
                 (_Head_base<0UL,_lemon::SmartDigraph_*,_false>)_Var16._M_head_impl;
            while (pdVar11 = local_160, p_Var13 = local_c0, local_128[0]._id != -1) {
              pDVar5 = (this->graph_ptr_)._M_t.
                       super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                       .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl;
              lVar12 = (long)local_128[0]._id;
              iVar2 = *(int *)(*(long *)((long)(pDVar5->lemon_graph_ptr)._M_t.
                                               super___uniq_ptr_impl<lemon::SmartDigraph,_std::default_delete<lemon::SmartDigraph>_>
                                        + 0x18) + lVar12 * 0x10);
              lVar14 = (long)iVar2;
              local_158 = *(long *)((long)(pDVar5->weight_map_ptr)._M_t.
                                          super___uniq_ptr_impl<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>,_std::default_delete<lemon::DigraphExtender<lemon::SmartDigraphBase>::ArcMap<double>_>_>
                                   + 0x18);
              local_b0.weight._0_4_ = 1;
              local_14c = iVar2;
              bVar10 = checkVertexVisited(this,(Directions *)&local_b0,&local_14c);
              if (((bVar10) && (iVar2 != (pDVar5->source).lemon_id)) &&
                 ((pSVar4 = (this->bwd_search_ptr_)._M_t.
                            super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                            .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl,
                  fwd_label->weight + *(double *)(local_158 + lVar12 * 8) +
                  **(double **)
                    (*(long *)&(pSVar4->best_labels).
                               super__Vector_base<std::shared_ptr<labelling::Label>,_std::allocator<std::shared_ptr<labelling::Label>_>_>
                               ._M_impl + lVar14 * 0x10) <= local_168 &&
                  (lVar6 = *(long *)&(pSVar4->efficient_labels).
                                     super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                                     ._M_impl, bwd_label = *(Label **)(lVar6 + lVar14 * 0x18),
                  lVar15 = local_158, bwd_label != *(Label **)(lVar6 + 8 + lVar14 * 0x18))))) {
                do {
                  if (((*local_138 <=
                        (bwd_label->resource_consumption).
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[local_130->critical_res]) &&
                      (fwd_label->weight + *(double *)(lVar15 + lVar12 * 8) + bwd_label->weight <=
                       local_168)) &&
                     (bVar10 = labelling::mergePreCheck(fwd_label,bwd_label,&this->max_res), bVar10)
                     ) {
                    local_169 = true;
                    DiGraph::getAdjVertex
                              (&local_118,
                               (this->graph_ptr_)._M_t.
                               super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                               .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>._M_head_impl,
                               local_128,&local_169);
                    labelling::mergeLabels
                              (&local_b0,fwd_label,bwd_label,&local_118,
                               &((this->graph_ptr_)._M_t.
                                 super___uniq_ptr_impl<bidirectional::DiGraph,_std::default_delete<bidirectional::DiGraph>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_bidirectional::DiGraph_*,_std::default_delete<bidirectional::DiGraph>_>
                                 .super__Head_base<0UL,_bidirectional::DiGraph_*,_false>.
                                _M_head_impl)->sink,&this->max_res,local_140);
                    if (local_118.resource_consumption.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start != (pointer)0x0) {
                      operator_delete(local_118.resource_consumption.
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                      super__Vector_impl_data._M_start,
                                      (long)local_118.resource_consumption.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                                      (long)local_118.resource_consumption.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
                    }
                    if (local_b0.vertex.lemon_id != -1) {
                      local_118.vertex = (Vertex)((ulong)local_118.vertex & 0xffffffffffffff00);
                      bVar10 = labelling::Label::checkFeasibility
                                         (&local_b0,&this->max_res,local_140,(bool *)&local_118);
                      if ((bVar10) &&
                         (bVar10 = labelling::halfwayCheck(&local_b0,&local_e8), bVar10)) {
                        pLVar7 = (this->best_label_).
                                 super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr;
                        if ((pLVar7->vertex).lemon_id != -1) {
                          local_118.vertex = (Vertex)((ulong)local_118.vertex & 0xffffffff00000000);
                          bVar10 = labelling::Label::fullDominance
                                             (&local_b0,pLVar7,(Directions *)&local_118);
                          if ((!bVar10) &&
                             (dVar1 = ((this->best_label_).
                                       super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->weight,
                             dVar1 < (double)CONCAT44(local_b0.weight._4_4_,local_b0.weight._0_4_)
                             || dVar1 == (double)CONCAT44(local_b0.weight._4_4_,
                                                          local_b0.weight._0_4_)))
                          goto LAB_001367ee;
                        }
                        local_118.vertex.lemon_id = 0;
                        local_118.vertex.user_id = 0;
                        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
                        __shared_count<labelling::Label,std::allocator<labelling::Label>,labelling::Label_const&>
                                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_118.weight,
                                   (Label **)&local_118,(allocator<labelling::Label> *)&local_169,
                                   &local_b0);
                        dVar1 = local_118.weight;
                        VVar8 = local_118.vertex;
                        local_118.vertex.lemon_id = 0;
                        local_118.vertex.user_id = 0;
                        local_118.weight = 0.0;
                        this_00 = (this->best_label_).
                                  super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount._M_pi;
                        (this->best_label_).
                        super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                             (element_type *)VVar8;
                        (this->best_label_).
                        super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                        ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)dVar1;
                        if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
                           (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118.weight !=
                           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
                          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                                     local_118.weight);
                        }
                        pLVar7 = (this->best_label_).
                                 super___shared_ptr<labelling::Label,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_ptr;
                        local_b8 = pLVar7->weight;
                        local_118.vertex = (Vertex)((ulong)local_118.vertex & 0xffffffff00000000);
                        bVar10 = terminate(this,(Directions *)&local_118,pLVar7);
                        if (bVar10) {
                          labelling::Label::~Label(&local_b0);
                          pdVar11 = local_160;
                          goto LAB_0013689c;
                        }
                        uVar17 = SUB84(local_b8,0);
                        uVar18 = (undefined4)((ulong)local_b8 >> 0x20);
                        if (local_168 <= local_b8) {
                          uVar17 = SUB84(local_168,0);
                          uVar18 = (undefined4)((ulong)local_168 >> 0x20);
                        }
                        local_168 = (double)CONCAT44(uVar18,uVar17);
                      }
                    }
LAB_001367ee:
                    std::vector<labelling::Label,_std::allocator<labelling::Label>_>::push_back
                              (&local_e8,&local_b0);
                    labelling::Label::~Label(&local_b0);
                    lVar15 = local_158;
                  }
                  bwd_label = bwd_label + 1;
                } while (bwd_label !=
                         *(Label **)
                          (*(long *)&(((this->bwd_search_ptr_)._M_t.
                                       super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                                       .super__Head_base<0UL,_bidirectional::Search_*,_false>.
                                      _M_head_impl)->efficient_labels).
                                     super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                                     ._M_impl + 8 + lVar14 * 0x18));
                lVar12 = (long)local_128[0]._id;
                _Var16._M_head_impl =
                     (SmartDigraph *)
                     local_120.super__Head_base<0UL,_lemon::SmartDigraph_*,_false>._M_head_impl;
              }
              local_128[0]._id =
                   *(int *)(*(long *)&((vector<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                                        *)((long)&(_Var16._M_head_impl)->
                                                  super_ExtendedSmartDigraphBase + 0x18))->
                                      super__Vector_base<lemon::SmartDigraphBase::ArcT,_std::allocator<lemon::SmartDigraphBase::ArcT>_>
                            + 0xc + lVar12 * 0x10);
            }
          }
          fwd_label = fwd_label + 1;
          lVar12 = (long)(int)p_Var13[1]._M_color;
          p_Var9 = local_c0;
        } while (fwd_label !=
                 *(Label **)
                  (*(long *)&(((this->fwd_search_ptr_)._M_t.
                               super___uniq_ptr_impl<bidirectional::Search,_std::default_delete<bidirectional::Search>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_bidirectional::Search_*,_std::default_delete<bidirectional::Search>_>
                               .super__Head_base<0UL,_bidirectional::Search_*,_false>._M_head_impl)
                             ->efficient_labels).
                             super__Vector_base<std::vector<labelling::Label,_std::allocator<labelling::Label>_>,_std::allocator<std::vector<labelling::Label,_std::allocator<labelling::Label>_>_>_>
                             ._M_impl + 8 + lVar12 * 0x18));
      }
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while (p_Var13 != local_c8);
  }
LAB_0013689c:
  std::vector<labelling::Label,_std::allocator<labelling::Label>_>::~vector(&local_e8);
  operator_delete(pdVar11,8);
  operator_delete(local_148,8);
  return;
}

Assistant:

void BiDirectional::joinLabels() {
  // ref id with critical_res
  SPDLOG_INFO("Merging");
  const int&    c_res   = params_ptr_->critical_res;
  double        UB      = getUB();
  const double& HF      = std::min(max_res_curr_[c_res], min_res_curr_[c_res]);
  auto          fwd_min = std::make_unique<double>();
  auto          bwd_min = std::make_unique<double>();
  // lower bounds on forward and backward labels
  getMinimumWeights(fwd_min.get(), bwd_min.get());

  std::vector<labelling::Label> merged_labels_;

  // for each vertex visited forward
  for (const int& n : fwd_search_ptr_->visited_vertices) {
    // if bound check fwd_label
    if (fwd_search_ptr_->best_labels[n]->weight + *bwd_min <= UB &&
        n != graph_ptr_->sink.lemon_id) {
      // for each forward label at n
      for (auto fwd_iter = fwd_search_ptr_->efficient_labels[n].cbegin();
           fwd_iter != fwd_search_ptr_->efficient_labels[n].cend();
           ++fwd_iter) {
        const labelling::Label& fwd_label = *fwd_iter;
        // if bound check fwd_label
        if (fwd_label.resource_consumption[c_res] <= HF &&
            fwd_label.weight + *bwd_min <= UB) {
          // for each successor of n
          for (LemonGraph::OutArcIt a(
                   *graph_ptr_->lemon_graph_ptr, graph_ptr_->getLNodeFromId(n));
               a != lemon::INVALID;
               ++a) {
            const int&    m           = graph_ptr_->getId(graph_ptr_->head(a));
            const double& edge_weight = graph_ptr_->getWeight(a);
            if (checkVertexVisited(BWD, m) &&
                m != graph_ptr_->source.lemon_id &&
                (fwd_label.weight + edge_weight +
                     bwd_search_ptr_->best_labels[m]->weight <=
                 UB)) {
              // for each backward label at m
              for (auto bwd_iter =
                       bwd_search_ptr_->efficient_labels[m].cbegin();
                   bwd_iter != bwd_search_ptr_->efficient_labels[m].cend();
                   ++bwd_iter) {
                const labelling::Label& bwd_label = *bwd_iter;
                // TODO: should suffice with strict > HF, but Beasley 10
                // fails
                if (bwd_label.resource_consumption[c_res] >= HF &&
                    (fwd_label.weight + edge_weight + bwd_label.weight <= UB) &&
                    labelling::mergePreCheck(fwd_label, bwd_label, max_res)) {
                  const labelling::Label& merged_label = labelling::mergeLabels(
                      fwd_label,
                      bwd_label,
                      graph_ptr_->getAdjVertex(a, true),
                      graph_ptr_->sink,
                      max_res,
                      min_res);
                  if (merged_label.vertex.lemon_id != -1 &&
                      merged_label.checkFeasibility(max_res, min_res) &&
                      labelling::halfwayCheck(merged_label, merged_labels_)) {
                    if (best_label_->vertex.lemon_id == -1 ||
                        (merged_label.fullDominance(*best_label_, FWD) ||
                         merged_label.weight < best_label_->weight)) {
                      // Save
                      best_label_ =
                          std::make_shared<labelling::Label>(merged_label);
                      SPDLOG_INFO(
                          "\t {} \t | \t {}",
                          getElapsedTime(),
                          best_label_->weight);
                      // Tighten UB
                      if (best_label_->weight < UB) {
                        UB = best_label_->weight;
                      }
                      // Stop if time out or threshold found
                      if (terminate(FWD, *best_label_)) {
                        return;
                      }
                    }
                  }
                  // Add merged label to list
                  merged_labels_.push_back(merged_label);
                } // else
                  // break;
              }
            }
          }
        } // else
          // break;
      }
    }
  }
}